

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringConst
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StringConst *curr
          )

{
  char *pcVar1;
  Literal local_58;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = (curr->string).super_IString.str._M_str;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,pcVar1,pcVar1 + (curr->string).super_IString.str._M_len);
  ::wasm::Literal::Literal(&local_58,(string *)local_40);
  Flow::Flow(__return_storage_ptr__,&local_58);
  ::wasm::Literal::~Literal(&local_58);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringConst(StringConst* curr) {
    return Literal(curr->string.toString());
  }